

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

bool __thiscall Expr::RequiresAnalyzerContext(Expr *this)

{
  bool bVar1;
  iterator this_00;
  char *pcVar2;
  long in_RDI;
  int i_2;
  iterator i_1;
  iterator i;
  ID *in_stack_ffffffffffffffa8;
  ID *in_stack_ffffffffffffffb0;
  FILE *__stream;
  int local_34;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_> local_28;
  Expr **local_20;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
  in_stack_ffffffffffffffe8;
  bool local_1;
  
  switch(*(undefined4 *)(in_RDI + 0x58)) {
  case 0:
    local_1 = ID::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  default:
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      if ((*(long *)(in_RDI + 0x60 + (long)local_34 * 8) != 0) &&
         (bVar1 = RequiresAnalyzerContext((Expr *)in_stack_ffffffffffffffe8._M_current), bVar1)) {
        if ((FLAGS_pac_debug & 1U) != 0) {
          __stream = _stderr;
          pcVar2 = orig((Expr *)0x1363cc);
          fprintf(__stream,"\'%s\' requires analyzer context\n",pcVar2);
        }
        return true;
      }
    }
    local_1 = false;
    break;
  case 5:
    local_1 = RequiresAnalyzerContext((Expr *)in_stack_ffffffffffffffe8._M_current);
    break;
  case 8:
    if (*(long *)(in_RDI + 0x98) != 0) {
      this_00 = std::vector<Expr_*,_std::allocator<Expr_*>_>::begin
                          ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffffa8);
      while( true ) {
        local_20 = (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::end
                                      ((vector<Expr_*,_std::allocator<Expr_*>_> *)
                                       in_stack_ffffffffffffffa8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                            *)in_stack_ffffffffffffffb0,
                           (__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                            *)in_stack_ffffffffffffffa8);
        if (!bVar1) break;
        __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
        operator*((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                  &stack0xffffffffffffffe8);
        bVar1 = RequiresAnalyzerContext((Expr *)this_00._M_current);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
        operator++((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                   &stack0xffffffffffffffe8);
      }
    }
    local_1 = false;
    break;
  case 0x21:
    if (*(long *)(in_RDI + 0xa0) != 0) {
      local_28._M_current =
           (CaseExpr **)
           std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin
                     ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)in_stack_ffffffffffffffa8);
      while( true ) {
        std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end
                  ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)in_stack_ffffffffffffffa8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                            *)in_stack_ffffffffffffffb0,
                           (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                            *)in_stack_ffffffffffffffa8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
        operator*(&local_28);
        bVar1 = CaseExpr::RequiresAnalyzerContext((CaseExpr *)0x136334);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
        operator++(&local_28);
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Expr::RequiresAnalyzerContext() const
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return *id_ == *analyzer_context_id;

		case EXPR_MEMBER:
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			return operand_[0]->RequiresAnalyzerContext();

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		case EXPR_CASE:
			{
			foreach (i, CaseExprList, cases_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] && operand_[i]->RequiresAnalyzerContext() )
					{
					DEBUG_MSG("'%s' requires analyzer context\n", operand_[i]->orig());
					return true;
					}
			return false;
		}
	}